

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_vss2.cpp
# Opt level: O0

void __thiscall
edk2_vss2_t::edk2_vss2_t(edk2_vss2_t *this,kstream *p__io,kstruct *p__parent,edk2_vss2_t *p__root)

{
  edk2_vss2_t *p__root_local;
  kstruct *p__parent_local;
  kstream *p__io_local;
  edk2_vss2_t *this_local;
  
  kaitai::kstruct::kstruct(&this->super_kstruct,p__io);
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__edk2_vss2_t_0026fda0;
  std::__cxx11::string::string((string *)&this->m_signature);
  std::
  unique_ptr<edk2_vss2_t::vss2_store_body_t,std::default_delete<edk2_vss2_t::vss2_store_body_t>>::
  unique_ptr<std::default_delete<edk2_vss2_t::vss2_store_body_t>,void>
            ((unique_ptr<edk2_vss2_t::vss2_store_body_t,std::default_delete<edk2_vss2_t::vss2_store_body_t>>
              *)&this->m_body);
  std::__cxx11::string::string((string *)&this->m__raw_body);
  std::unique_ptr<kaitai::kstream,std::default_delete<kaitai::kstream>>::
  unique_ptr<std::default_delete<kaitai::kstream>,void>
            ((unique_ptr<kaitai::kstream,std::default_delete<kaitai::kstream>> *)
             &this->m__io__raw_body);
  this->m__parent = p__parent;
  this->m__root = this;
  std::
  unique_ptr<edk2_vss2_t::vss2_store_body_t,_std::default_delete<edk2_vss2_t::vss2_store_body_t>_>::
  operator=(&this->m_body,(nullptr_t)0x0);
  std::unique_ptr<kaitai::kstream,_std::default_delete<kaitai::kstream>_>::operator=
            (&this->m__io__raw_body,(nullptr_t)0x0);
  this->f_len_vss2_store_header = false;
  _read(this);
  return;
}

Assistant:

edk2_vss2_t::edk2_vss2_t(kaitai::kstream* p__io, kaitai::kstruct* p__parent, edk2_vss2_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = this; (void)p__root;
    m_body = nullptr;
    m__io__raw_body = nullptr;
    f_len_vss2_store_header = false;
    _read();
}